

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

uint8 * google::protobuf::internal::SerializeInternalToArray
                  (uint8 *base,FieldMetadata *field_metadata_table,int32 num_fields,
                  bool is_deterministic,uint8 *buffer)

{
  FieldMetadata *md;
  float fVar1;
  bool bVar2;
  int64 iVar3;
  float *pfVar4;
  undefined1 *puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  double *field;
  uint32 *has_bits_array;
  ArrayOutput array_output;
  CodedOutputStream output;
  ArrayOutputStream array_stream;
  ArrayOutput local_b0;
  CodedOutputStream local_a0;
  ArrayOutputStream local_50;
  
  if (0 < num_fields) {
    uVar8 = 0;
    local_b0.ptr = buffer;
    local_b0.is_deterministic = is_deterministic;
    do {
      uVar7 = field_metadata_table[uVar8].type;
      if (0x69 < uVar7) {
switchD_00278ece_caseD_12:
        SerializeNotImplemented(uVar7);
        goto LAB_00279d5a;
      }
      md = field_metadata_table + uVar8;
      field = (double *)(base + md->offset);
      switch(uVar7) {
      case 0:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) {
LAB_00279c68:
            *local_b0.ptr = (char)uVar7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
          }
          else {
            *local_b0.ptr = (byte)uVar7 | 0x80;
            uVar6 = uVar7 >> 7;
            if (0x3fff < uVar7) {
              local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
              do {
                *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
                uVar7 = uVar6 >> 7;
                local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
                bVar2 = 0x3fff < uVar6;
                uVar6 = uVar7;
              } while (bVar2);
              goto LAB_00279d1d;
            }
LAB_00279caf:
            *(char *)((long)local_b0.ptr + 1) = (char)uVar6;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          }
LAB_00279d20:
          *(double *)local_b0.ptr = *field;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 8);
        }
        break;
      case 1:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) {
LAB_00279b2c:
            *local_b0.ptr = (char)uVar7;
            pfVar4 = (float *)((long)local_b0.ptr + 1);
          }
          else {
            *local_b0.ptr = (byte)uVar7 | 0x80;
            uVar6 = uVar7 >> 7;
            if (0x3fff < uVar7) {
              pfVar4 = (float *)((long)local_b0.ptr + 2);
              do {
                *(byte *)((long)pfVar4 + -1) = (byte)uVar6 | 0x80;
                uVar7 = uVar6 >> 7;
                pfVar4 = (float *)((long)pfVar4 + 1);
                bVar2 = 0x3fff < uVar6;
                uVar6 = uVar7;
              } while (bVar2);
              goto LAB_00279d4a;
            }
LAB_00279ccc:
            *(char *)((long)local_b0.ptr + 1) = (char)uVar6;
            pfVar4 = (float *)((long)local_b0.ptr + 2);
          }
LAB_00279d4d:
          *pfVar4 = *(float *)field;
          local_b0.ptr = (uint8 *)(pfVar4 + 1);
        }
        break;
      case 2:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_0027953b:
          SingularFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 3:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_00279654:
          SingularFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 4:
        fVar1 = (float)(*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >>
                        (md->has_offset & 0x1f) & 1);
        goto joined_r0x0027949b;
      case 5:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_00279c68;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_00279caf;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
LAB_00279d1d:
          *(char *)((long)local_b0.ptr + -1) = (char)uVar7;
          goto LAB_00279d20;
        }
        break;
      case 6:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_00279b2c;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_00279ccc;
          pfVar4 = (float *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)pfVar4 + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            pfVar4 = (float *)((long)pfVar4 + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
LAB_00279d4a:
          *(char *)((long)pfVar4 + -1) = (char)uVar7;
          goto LAB_00279d4d;
        }
        break;
      case 7:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) {
LAB_002794d0:
            *local_b0.ptr = (char)uVar7;
            puVar5 = (undefined1 *)((long)local_b0.ptr + 1);
          }
          else {
            *local_b0.ptr = (byte)uVar7 | 0x80;
            uVar6 = uVar7 >> 7;
            if (uVar7 < 0x4000) goto LAB_00279c92;
            puVar5 = (undefined1 *)((long)local_b0.ptr + 2);
            do {
              puVar5[-1] = (byte)uVar6 | 0x80;
              uVar7 = uVar6 >> 7;
              puVar5 = puVar5 + 1;
              bVar2 = 0x3fff < uVar6;
              uVar6 = uVar7;
            } while (bVar2);
LAB_00279cf3:
            puVar5[-1] = (char)uVar7;
          }
LAB_00279cf6:
          *puVar5 = *(undefined1 *)field;
          local_b0.ptr = puVar5 + 1;
        }
        break;
      case 8:
      case 0xb:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_00278f32:
          SingularFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 9:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_00279512:
          SingularFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 10:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_00279b9e:
          SingularFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 0xc:
        fVar1 = (float)(*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >>
                        (md->has_offset & 0x1f) & 1);
        goto joined_r0x00279643;
      case 0xd:
        fVar1 = (float)(*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >>
                        (md->has_offset & 0x1f) & 1);
        goto joined_r0x0027929d;
      case 0xe:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_00279b2c;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_00279ccc;
          pfVar4 = (float *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)pfVar4 + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            pfVar4 = (float *)((long)pfVar4 + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_00279d4a;
        }
        break;
      case 0xf:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_00279c68;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_00279caf;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_00279d1d;
        }
        break;
      case 0x10:
        fVar1 = (float)(*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >>
                        (md->has_offset & 0x1f) & 1);
        goto joined_r0x00279b5d;
      case 0x11:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_00279a6d:
          SingularFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      default:
        goto switchD_00278ece_caseD_12;
      case 0x14:
        if ((*(uint *)(base + (ulong)(md->has_offset >> 5) * 4) >> (md->has_offset & 0x1f) & 1) != 0
           ) {
LAB_002798e4:
          SingularFieldHelper<21>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 0x15:
        if ((*field != 0.0) || (NAN(*field))) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_00279c68;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_00279caf;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_00279d1d;
        }
        break;
      case 0x16:
        if ((*(float *)field != 0.0) || (NAN(*(float *)field))) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_00279b2c;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_00279ccc;
          pfVar4 = (float *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)pfVar4 + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            pfVar4 = (float *)((long)pfVar4 + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_00279d4a;
        }
        break;
      case 0x17:
        if (*field != 0.0) goto LAB_0027953b;
        break;
      case 0x18:
        if (*field != 0.0) goto LAB_00279654;
        break;
      case 0x19:
        fVar1 = *(float *)field;
joined_r0x0027949b:
        if (fVar1 != 0.0) {
LAB_0027967d:
          SingularFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 0x1a:
        if (*field != 0.0) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_00279c68;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_00279caf;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_00279d1d;
        }
        break;
      case 0x1b:
        if (*(float *)field != 0.0) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_00279b2c;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_00279ccc;
          pfVar4 = (float *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)pfVar4 + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            pfVar4 = (float *)((long)pfVar4 + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_00279d4a;
        }
        break;
      case 0x1c:
        if (*(char *)field != '\0') {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_002794d0;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (0x3fff < uVar7) {
            puVar5 = (undefined1 *)((long)local_b0.ptr + 2);
            do {
              puVar5[-1] = (byte)uVar6 | 0x80;
              uVar7 = uVar6 >> 7;
              puVar5 = puVar5 + 1;
              bVar2 = 0x3fff < uVar6;
              uVar6 = uVar7;
            } while (bVar2);
            goto LAB_00279cf3;
          }
LAB_00279c92:
          *(char *)((long)local_b0.ptr + 1) = (char)uVar6;
          puVar5 = (undefined1 *)((long)local_b0.ptr + 2);
          goto LAB_00279cf6;
        }
        break;
      case 0x1d:
      case 0x20:
        if (*(long *)((long)*field + 8) != 0) goto LAB_00278f32;
        break;
      case 0x1e:
        if (*field != 0.0) goto LAB_00279512;
        break;
      case 0x1f:
        if (*field != 0.0) goto LAB_00279b9e;
        break;
      case 0x21:
        fVar1 = *(float *)field;
joined_r0x00279643:
        if (fVar1 != 0.0) {
LAB_002796a6:
          SingularFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 0x22:
        fVar1 = *(float *)field;
joined_r0x0027929d:
        if (fVar1 != 0.0) {
LAB_002799eb:
          SingularFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 0x23:
        if (*(float *)field != 0.0) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_00279b2c;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_00279ccc;
          pfVar4 = (float *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)pfVar4 + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            pfVar4 = (float *)((long)pfVar4 + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_00279d4a;
        }
        break;
      case 0x24:
        if (*field != 0.0) {
          uVar7 = md->tag;
          if (uVar7 < 0x80) goto LAB_00279c68;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_00279caf;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_00279d1d;
        }
        break;
      case 0x25:
        fVar1 = *(float *)field;
joined_r0x00279b5d:
        if (fVar1 != 0.0) {
LAB_00279b63:
          SingularFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                    (field,md,&local_b0);
        }
        break;
      case 0x26:
        if (*field != 0.0) goto LAB_00279a6d;
        break;
      case 0x29:
        if (field[1] != 0.0) goto LAB_002798e4;
        break;
      case 0x2a:
        RepeatedFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x2b:
        RepeatedFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x2c:
        RepeatedFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x2d:
        RepeatedFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x2e:
        RepeatedFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x2f:
        RepeatedFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x30:
        RepeatedFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x31:
        RepeatedFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x32:
      case 0x35:
      case 0x3e:
        RepeatedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x33:
        RepeatedFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x34:
        RepeatedFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x36:
        RepeatedFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x37:
        RepeatedFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x38:
        RepeatedFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x39:
        RepeatedFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x3a:
        RepeatedFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x3b:
        RepeatedFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x3f:
        PackedFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x40:
        PackedFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x41:
        PackedFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x42:
        PackedFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x43:
        PackedFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x44:
        PackedFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x45:
        PackedFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x46:
        PackedFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x53:
        PackedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>(field,md,&local_b0)
        ;
        break;
      case 0x4b:
        PackedFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x4c:
        PackedFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x4d:
        PackedFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x4e:
        PackedFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x4f:
        PackedFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x50:
        PackedFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                  (field,md,&local_b0);
        break;
      case 0x54:
        uVar7 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar7 >> 3) {
          if (uVar7 < 0x80) goto LAB_00279c68;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_00279caf;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_00279d1d;
        }
        break;
      case 0x55:
        uVar7 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar7 >> 3) {
          if (uVar7 < 0x80) goto LAB_00279b2c;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_00279ccc;
          pfVar4 = (float *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)pfVar4 + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            pfVar4 = (float *)((long)pfVar4 + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_00279d4a;
        }
        break;
      case 0x56:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_0027953b;
        break;
      case 0x57:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_00279654;
        break;
      case 0x58:
        if (*(uint *)(base + md->has_offset) != md->tag >> 3) break;
        goto LAB_0027967d;
      case 0x59:
        uVar7 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar7 >> 3) {
          if (uVar7 < 0x80) goto LAB_00279c68;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_00279caf;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_00279d1d;
        }
        break;
      case 0x5a:
        uVar7 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar7 >> 3) {
          if (uVar7 < 0x80) goto LAB_00279b2c;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_00279ccc;
          pfVar4 = (float *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)pfVar4 + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            pfVar4 = (float *)((long)pfVar4 + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_00279d4a;
        }
        break;
      case 0x5b:
        uVar7 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar7 >> 3) {
          if (uVar7 < 0x80) goto LAB_002794d0;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (0x3fff < uVar7) {
            puVar5 = (undefined1 *)((long)local_b0.ptr + 2);
            do {
              puVar5[-1] = (byte)uVar6 | 0x80;
              uVar7 = uVar6 >> 7;
              puVar5 = puVar5 + 1;
              bVar2 = 0x3fff < uVar6;
              uVar6 = uVar7;
            } while (bVar2);
            goto LAB_00279cf3;
          }
          goto LAB_00279c92;
        }
        break;
      case 0x5c:
      case 0x5f:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_00278f32;
        break;
      case 0x5d:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_00279512;
        break;
      case 0x5e:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_00279b9e;
        break;
      case 0x60:
        if (*(uint *)(base + md->has_offset) != md->tag >> 3) break;
        goto LAB_002796a6;
      case 0x61:
        if (*(uint *)(base + md->has_offset) != md->tag >> 3) break;
        goto LAB_002799eb;
      case 0x62:
        uVar7 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar7 >> 3) {
          if (uVar7 < 0x80) goto LAB_00279b2c;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_00279ccc;
          pfVar4 = (float *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)pfVar4 + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            pfVar4 = (float *)((long)pfVar4 + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_00279d4a;
        }
        break;
      case 99:
        uVar7 = md->tag;
        if (*(uint *)(base + md->has_offset) == uVar7 >> 3) {
          if (uVar7 < 0x80) goto LAB_00279c68;
          *local_b0.ptr = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          if (uVar7 < 0x4000) goto LAB_00279caf;
          local_b0.ptr = (uint8 *)((long)local_b0.ptr + 2);
          do {
            *(byte *)((long)local_b0.ptr + -1) = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            local_b0.ptr = (uint8 *)((long)local_b0.ptr + 1);
            bVar2 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar2);
          goto LAB_00279d1d;
        }
        break;
      case 100:
        if (*(uint *)(base + md->has_offset) != md->tag >> 3) break;
        goto LAB_00279b63;
      case 0x65:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) goto LAB_00279a6d;
        break;
      case 0x68:
        if (*(uint *)(base + md->has_offset) == md->tag >> 3) {
          field = (double *)*field;
          goto LAB_002798e4;
        }
        break;
      case 0x69:
        io::ArrayOutputStream::ArrayOutputStream(&local_50,local_b0.ptr,0x7fffffff,-1);
        io::CodedOutputStream::CodedOutputStream
                  (&local_a0,&local_50.super_ZeroCopyOutputStream,true);
        local_a0.impl_.is_serialization_deterministic_ = is_deterministic;
        (*(code *)md->ptr)(base,md->offset,md->tag,md->has_offset);
        iVar3 = io::EpsCopyOutputStream::ByteCount(&local_a0.impl_,local_a0.cur_);
        local_b0.ptr = (uint8 *)((long)local_b0.ptr +
                                (long)((int)iVar3 - (int)local_a0.start_count_));
        io::CodedOutputStream::~CodedOutputStream(&local_a0);
      }
LAB_00279d5a:
      uVar8 = uVar8 + 1;
      buffer = local_b0.ptr;
    } while (uVar8 != (uint)num_fields);
  }
  return (uint8 *)(double *)buffer;
}

Assistant:

uint8* SerializeInternalToArray(const uint8* base,
                                const FieldMetadata* field_metadata_table,
                                int32 num_fields, bool is_deterministic,
                                uint8* buffer) {
  ArrayOutput array_output = {buffer, is_deterministic};
  ArrayOutput* output = &array_output;
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);
      SERIALIZERS_FOR_TYPE(FieldMetadata::kInlinedType);
      // Special cases
      case FieldMetadata::kSpecial: {
        io::ArrayOutputStream array_stream(array_output.ptr, INT_MAX);
        io::CodedOutputStream output(&array_stream);
        output.SetSerializationDeterministic(is_deterministic);
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, &output);
        array_output.ptr += output.ByteCount();
      } break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
  return array_output.ptr;
}